

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseVisibilityTest_Edition2023NestedKeywordName_Test::
~ParseVisibilityTest_Edition2023NestedKeywordName_Test
          (ParseVisibilityTest_Edition2023NestedKeywordName_Test *this)

{
  ParseVisibilityTest_Edition2023NestedKeywordName_Test *this_local;
  
  ~ParseVisibilityTest_Edition2023NestedKeywordName_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseVisibilityTest, Edition2023NestedKeywordName) {
  ExpectParsesTo(
      R"schema(
        edition = "2023";
        message MySimpleMessage {
          local.pkg_name.SomeMessage msg = 1;
          export.other_pkg_name.SomeMessage other_msg = 2;
        }
        )schema",
      R"pb(
        message_type {
          name: "MySimpleMessage"
          field {
            name: "msg"
            number: 1
            label: LABEL_OPTIONAL
            type_name: "local.pkg_name.SomeMessage"
          }
          field {
            name: "other_msg"
            number: 2
            label: LABEL_OPTIONAL
            type_name: "export.other_pkg_name.SomeMessage"
          }
        }
        syntax: "editions"
        edition: EDITION_2023
      )pb");
}